

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.hpp
# Opt level: O1

shared_ptr<utils::detail::shared_ptr_continer> __thiscall
utils::detail::weak_ptr_continer_imp<std::weak_ptr<subject>_>::lock
          (weak_ptr_continer_imp<std::weak_ptr<subject>_> *this)

{
  int iVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  bool bVar4;
  shared_ptr<utils::detail::shared_ptr_continer> sVar5;
  undefined1 local_29;
  shared_ptr<subject> local_28;
  weak_ptr_continer local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
  if (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count;
    do {
      if (iVar2 == 0) {
        local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count;
      bVar4 = iVar2 == iVar1;
      if (bVar4) {
        (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count == 0;
  }
  local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  if (!bVar4) {
    local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(in_RSI + 8);
  }
  local_18._vptr_weak_ptr_continer = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>>,std::allocator<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>>>,std::shared_ptr<subject>>
            (&local_10,(shared_ptr_continer_imp<std::shared_ptr<subject>_> **)&local_18,
             (allocator<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>_>_> *)
             &local_29,&local_28);
  _Var3._M_pi = local_10._M_pi;
  (this->super_weak_ptr_continer)._vptr_weak_ptr_continer = local_18._vptr_weak_ptr_continer;
  (this->m_weak).super___weak_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_weak).super___weak_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_pi;
  local_18._vptr_weak_ptr_continer = (_func_int **)0x0;
  _Var3._M_pi = extraout_RDX;
  if (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<utils::detail::shared_ptr_continer>)
         sVar5.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<shared_ptr_continer> lock() const
    {
        using SharedPtrType = typename smart_ptr_traits<WeakPtrType>::share_type;
        return std::make_shared<shared_ptr_continer_imp<SharedPtrType>>(m_weak.lock());
    }